

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ProceduralAssignStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ProceduralAssignStatement,slang::ast::Expression_const&,bool&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,bool *args_1,SourceRange *args_2)

{
  SourceRange sourceRange;
  ProceduralAssignStatement *pPVar1;
  size_t in_RCX;
  Expression *in_RDX;
  ProceduralAssignStatement *in_RSI;
  SourceLocation in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pPVar1 = (ProceduralAssignStatement *)
           allocate((BumpAllocator *)in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = unaff_retaddr;
  sourceRange.startLoc = in_RDI;
  slang::ast::ProceduralAssignStatement::ProceduralAssignStatement
            (in_RSI,in_RDX,SUB81(in_RCX >> 0x38,0),sourceRange);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }